

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void deqp::gles3::Functional::evalTexture2DShadowProjGrad
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float lod;
  float fVar4;
  
  fVar4 = c->in[0].m_data[2];
  fVar1 = c->in[0].m_data[3];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  lod = computeLodFromGrad2D(c);
  fVar4 = texture2DShadow(c,fVar4 / fVar1,fVar2 / fVar1,fVar3 / fVar1,lod);
  (c->color).m_data[0] = fVar4;
  return;
}

Assistant:

static void		evalTexture2DShadowProjGrad			(gls::ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DShadow(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), computeLodFromGrad2D(c)); }